

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

int TIFFReadCustomDirectory(TIFF *tif,toff_t diroff,TIFFFieldArray *infoarray)

{
  short sVar1;
  uint16_t uVar2;
  int iVar3;
  TIFFReadDirEntryErr err;
  undefined6 extraout_var;
  TIFFDirEntry *pTVar4;
  TIFFField *pTVar5;
  TIFFField *pTVar6;
  ulong uVar7;
  ushort uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  short sVar13;
  double dVar14;
  UInt64Aligned_t m;
  TIFFDirEntry *dir;
  uint local_54;
  undefined8 local_50;
  uint local_48;
  uint32_t local_44;
  ulong local_40;
  TIFFDirEntry *local_38;
  
  (*tif->tif_cleanup)(tif);
  _TIFFSetupFields(tif,infoarray);
  uVar10 = 0;
  uVar2 = TIFFFetchDirectory(tif,diroff,&local_38,(uint64_t *)0x0);
  if (uVar2 == 0) {
    iVar3 = 0;
    TIFFErrorExtR(tif,"TIFFReadCustomDirectory","Failed to read custom directory at offset %lu",
                  diroff);
  }
  else {
    uVar7 = CONCAT62(extraout_var,uVar2) & 0xffffffff;
    TIFFFreeDirectory(tif);
    _TIFFmemset(&tif->tif_dir,0,0x158);
    pTVar4 = local_38;
    uVar11 = uVar7;
    do {
      if (pTVar4->tdir_tag < uVar10) {
        TIFFWarningExtR(tif,"TIFFReadDirectoryCheckOrder",
                        "Invalid TIFF directory; tags are not sorted in ascending order");
        break;
      }
      uVar10 = pTVar4->tdir_tag + 1;
      pTVar4 = pTVar4 + 1;
      uVar8 = (short)uVar11 - 1;
      uVar11 = (ulong)uVar8;
    } while (uVar8 != 0);
    uVar11 = 1;
    if (1 < (ushort)uVar7) {
      uVar11 = CONCAT62(extraout_var,uVar2) & 0xffffffff;
    }
    sVar13 = 0;
    local_48 = (uint)uVar11;
    pTVar4 = local_38;
    do {
      uVar2 = pTVar4->tdir_tag;
      TIFFReadDirectoryFindFieldInfo(tif,uVar2,&local_54);
      if (local_54 == 0xffffffff) {
        TIFFWarningExtR(tif,"TIFFReadCustomDirectory","Unknown field with tag %u (0x%x) encountered"
                        ,(ulong)uVar2,(ulong)uVar2);
        pTVar5 = _TIFFCreateAnonField(tif,(uint)pTVar4->tdir_tag,(uint)pTVar4->tdir_type);
        iVar3 = _TIFFMergeFields(tif,pTVar5,1);
        uVar8 = pTVar4->tdir_tag;
        if (iVar3 == 0) {
          TIFFWarningExtR(tif,"TIFFReadCustomDirectory",
                          "Registering anonymous field with tag %u (0x%x) failed",(ulong)uVar8,
                          (ulong)uVar8);
          pTVar4->tdir_ignore = '\x01';
          uVar11 = (ulong)local_48;
        }
        else {
          TIFFReadDirectoryFindFieldInfo(tif,uVar8,&local_54);
          uVar11 = (ulong)local_48;
          if (local_54 == 0xffffffff) {
            __assert_fail("fii != FAILED_FII",
                          "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                          ,0x1424,
                          "int TIFFReadCustomDirectory(TIFF *, toff_t, const TIFFFieldArray *)");
          }
        }
      }
      if (pTVar4->tdir_ignore == '\0') {
        pTVar5 = tif->tif_fields[local_54];
        if (pTVar5->field_bit == 0) {
LAB_00298327:
          pTVar4->tdir_ignore = '\x01';
        }
        else {
          uVar7 = (ulong)local_54;
          pTVar6 = pTVar5;
          while( true ) {
            pTVar5 = pTVar6;
            local_54 = (uint)uVar7;
            if ((pTVar5->field_type == TIFF_NOTYPE) ||
               (pTVar5->field_type == (uint)pTVar4->tdir_type)) break;
            uVar7 = (ulong)(local_54 + 1);
            local_54 = 0xffff;
            if ((tif->tif_nfields == uVar7) ||
               (pTVar6 = tif->tif_fields[uVar7], pTVar6->field_tag != (uint)pTVar4->tdir_tag))
            break;
          }
          if (local_54 == 0xffff) {
            TIFFWarningExtR(tif,"TIFFReadCustomDirectory",
                            "Wrong data type %u for \"%s\"; tag ignored",(ulong)pTVar4->tdir_type,
                            pTVar5->field_name);
            goto LAB_00298327;
          }
          sVar1 = pTVar5->field_readcount;
          if ((sVar1 != -3) && (sVar1 != -1)) {
            if (sVar1 == -2) {
              uVar10 = (uint)(tif->tif_dir).td_samplesperpixel;
            }
            else {
              uVar10 = (uint)sVar1;
            }
            uVar12 = (ulong)uVar10;
            uVar7 = pTVar4->tdir_count;
            if (uVar7 < uVar12) {
              local_40 = uVar7;
              pTVar6 = TIFFFieldWithTag(tif,(uint)pTVar4->tdir_tag);
              pcVar9 = "unknown tagname";
              if (pTVar6 != (TIFFField *)0x0) {
                pcVar9 = pTVar6->field_name;
              }
              TIFFWarningExtR(tif,tif->tif_name,
                              "incorrect count for field \"%s\" (%lu, expecting %u); tag ignored",
                              pcVar9,pTVar4->tdir_count,uVar12);
              uVar7 = local_40;
            }
            else if (uVar12 < uVar7) {
              local_40 = uVar7;
              pTVar6 = TIFFFieldWithTag(tif,(uint)pTVar4->tdir_tag);
              pcVar9 = "unknown tagname";
              if (pTVar6 != (TIFFField *)0x0) {
                pcVar9 = pTVar6->field_name;
              }
              TIFFWarningExtR(tif,tif->tif_name,
                              "incorrect count for field \"%s\" (%lu, expecting %u); tag trimmed",
                              pcVar9,pTVar4->tdir_count,uVar12);
              pTVar4->tdir_count = uVar12;
              uVar7 = local_40;
            }
            if (uVar7 < uVar12) goto LAB_00298327;
          }
        }
        if (pTVar4->tdir_ignore == '\0') {
          if ((pTVar4->tdir_tag == 0x9206) && (iVar3 = TIFFFieldIsAnonymous(pTVar5), iVar3 == 0)) {
            local_50 = 0;
            err = TIFFReadDirEntryErrCount;
            if ((pTVar4->tdir_count == 1) && (err = TIFFReadDirEntryErrType, pTVar4->tdir_type == 5)
               ) {
              if ((tif->tif_flags >> 0x13 & 1) == 0) {
                local_44 = (pTVar4->tdir_offset).toff_long;
                if ((char)tif->tif_flags < '\0') {
                  TIFFSwabLong(&local_44);
                }
                err = TIFFReadDirEntryData(tif,(ulong)local_44,8,&local_50);
              }
              else {
                local_50 = (pTVar4->tdir_offset).toff_long8;
                err = TIFFReadDirEntryErrOk;
              }
            }
            if (err == TIFFReadDirEntryErrOk) {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabArrayOfLong((uint32_t *)&local_50,2);
              }
              if ((uint32_t)local_50 == 0) {
                dVar14 = 0.0;
              }
              else {
                dVar14 = -1.0;
                if (local_50._4_4_ != 0 && (uint32_t)local_50 != 0xffffffff) {
                  dVar14 = (double)(local_50 & 0xffffffff) / (double)local_50._4_4_;
                }
              }
              TIFFSetField(tif,(uint)pTVar4->tdir_tag,dVar14);
            }
            else {
              TIFFReadDirEntryOutputErr(tif,err,"TIFFFetchSubjectDistance","SubjectDistance",1);
            }
          }
          else {
            TIFFFetchNormalTag(tif,pTVar4,1);
          }
        }
      }
      sVar13 = sVar13 + 1;
      pTVar4 = pTVar4 + 1;
    } while (sVar13 != (short)uVar11);
    tif->tif_setdirectory_force_absolute = 1;
    iVar3 = 1;
    if (local_38 != (TIFFDirEntry *)0x0) {
      _TIFFfreeExt(tif,local_38);
    }
  }
  return iVar3;
}

Assistant:

int TIFFReadCustomDirectory(TIFF *tif, toff_t diroff,
                            const TIFFFieldArray *infoarray)
{
    static const char module[] = "TIFFReadCustomDirectory";
    TIFFDirEntry *dir;
    uint16_t dircount;
    TIFFDirEntry *dp;
    uint16_t di;
    const TIFFField *fip;
    uint32_t fii;
    (*tif->tif_cleanup)(tif); /* cleanup any previous compression state */
    _TIFFSetupFields(tif, infoarray);
    dircount = TIFFFetchDirectory(tif, diroff, &dir, NULL);
    if (!dircount)
    {
        TIFFErrorExtR(tif, module,
                      "Failed to read custom directory at offset %" PRIu64,
                      diroff);
        return 0;
    }
    TIFFFreeDirectory(tif);
    _TIFFmemset(&tif->tif_dir, 0, sizeof(TIFFDirectory));
    TIFFReadDirectoryCheckOrder(tif, dir, dircount);
    for (di = 0, dp = dir; di < dircount; di++, dp++)
    {
        TIFFReadDirectoryFindFieldInfo(tif, dp->tdir_tag, &fii);
        if (fii == FAILED_FII)
        {
            TIFFWarningExtR(tif, module,
                            "Unknown field with tag %" PRIu16 " (0x%" PRIx16
                            ") encountered",
                            dp->tdir_tag, dp->tdir_tag);
            if (!_TIFFMergeFields(
                    tif,
                    _TIFFCreateAnonField(tif, dp->tdir_tag,
                                         (TIFFDataType)dp->tdir_type),
                    1))
            {
                TIFFWarningExtR(tif, module,
                                "Registering anonymous field with tag %" PRIu16
                                " (0x%" PRIx16 ") failed",
                                dp->tdir_tag, dp->tdir_tag);
                dp->tdir_ignore = TRUE;
            }
            else
            {
                TIFFReadDirectoryFindFieldInfo(tif, dp->tdir_tag, &fii);
                assert(fii != FAILED_FII);
            }
        }
        if (!dp->tdir_ignore)
        {
            fip = tif->tif_fields[fii];
            if (fip->field_bit == FIELD_IGNORE)
                dp->tdir_ignore = TRUE;
            else
            {
                /* check data type */
                while ((fip->field_type != TIFF_ANY) &&
                       (fip->field_type != dp->tdir_type))
                {
                    fii++;
                    if ((fii == tif->tif_nfields) ||
                        (tif->tif_fields[fii]->field_tag !=
                         (uint32_t)dp->tdir_tag))
                    {
                        fii = 0xFFFF;
                        break;
                    }
                    fip = tif->tif_fields[fii];
                }
                if (fii == 0xFFFF)
                {
                    TIFFWarningExtR(tif, module,
                                    "Wrong data type %" PRIu16
                                    " for \"%s\"; tag ignored",
                                    dp->tdir_type, fip->field_name);
                    dp->tdir_ignore = TRUE;
                }
                else
                {
                    /* check count if known in advance */
                    if ((fip->field_readcount != TIFF_VARIABLE) &&
                        (fip->field_readcount != TIFF_VARIABLE2))
                    {
                        uint32_t expected;
                        if (fip->field_readcount == TIFF_SPP)
                            expected =
                                (uint32_t)tif->tif_dir.td_samplesperpixel;
                        else
                            expected = (uint32_t)fip->field_readcount;
                        if (!CheckDirCount(tif, dp, expected))
                            dp->tdir_ignore = TRUE;
                    }
                }
            }
            if (!dp->tdir_ignore)
            {
                switch (dp->tdir_tag)
                {
                    case EXIFTAG_SUBJECTDISTANCE:
                        if (!TIFFFieldIsAnonymous(fip))
                        {
                            /* should only be called on a Exif directory */
                            /* when exifFields[] is active */
                            (void)TIFFFetchSubjectDistance(tif, dp);
                        }
                        else
                        {
                            (void)TIFFFetchNormalTag(tif, dp, TRUE);
                        }
                        break;
                    default:
                        (void)TIFFFetchNormalTag(tif, dp, TRUE);
                        break;
                }
            } /*-- if (!dp->tdir_ignore) */
        }
    }
    /* To be able to return from SubIFD or custom-IFD to main-IFD */
    tif->tif_setdirectory_force_absolute = TRUE;
    if (dir)
        _TIFFfreeExt(tif, dir);
    return 1;
}